

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleTypeHandler<6UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<6UL> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  uint uVar1;
  bool bVar2;
  uint pi;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  
  entry = record->properties;
  uVar3 = 0;
  do {
    uVar1 = record->propertyCount;
    if (uVar1 <= uVar3) {
LAB_00cc1b8f:
      return uVar1 <= uVar3;
    }
    bVar2 = IsObjTypeSpecEquivalent(this,type,entry);
    if (!bVar2) {
      *failedPropertyIndex = (uint)uVar3;
      goto LAB_00cc1b8f;
    }
    uVar3 = uVar3 + 1;
    entry = entry + 1;
  } while( true );
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < record.propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }